

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeGenerator.cpp
# Opt level: O2

void AddVarsToScope(ParseNode *vars,ByteCodeGenerator *byteCodeGenerator)

{
  Type *pTVar1;
  ScopeInfo *pSVar2;
  bool bVar3;
  ByteCodeGenerator *this;
  ParseNodeVar *pPVar4;
  char16 *pcVar5;
  FuncInfo *pFVar6;
  FunctionBody *pFVar7;
  int keyLength;
  ByteCodeGenerator *key;
  
  key = byteCodeGenerator;
  do {
    if (vars == (ParseNode *)0x0) {
      return;
    }
    ParseNode::AsParseNodeVar(vars);
    ParseNode::AsParseNodeVar(vars);
    this = (ByteCodeGenerator *)
           ByteCodeGenerator::AddSymbolToFunctionScope
                     (byteCodeGenerator,(char16 *)key,keyLength,vars,STFunction);
    if (*(SymbolType *)&this->parentScopeInfo == STVariable) {
      bVar3 = ByteCodeGenerator::Trace(byteCodeGenerator);
      if (bVar3) {
        pPVar4 = ParseNode::AsParseNodeVar(vars);
        key = (ByteCodeGenerator *)&pPVar4->pid->field_0x22;
        pcVar5 = Symbol::GetSymbolTypeName((Symbol *)this);
        Output::Print(L"current context has declared var %s of type %s\n",key,pcVar5);
      }
    }
    bVar3 = Symbol::IsArguments((Symbol *)this);
    if (bVar3) {
LAB_0077f2ee:
      pPVar4 = ParseNode::AsParseNodeVar(vars);
      pPVar4->sym = (Symbol *)this;
      bVar3 = Symbol::IsArguments((Symbol *)this);
      if (bVar3) {
        pFVar6 = ByteCodeGenerator::TopFuncInfo(byteCodeGenerator);
        FuncInfo::SetArgumentsSymbol(pFVar6,(Symbol *)this);
        key = this;
      }
      else {
        bVar3 = Symbol::IsSpecialSymbol((Symbol *)this);
        if (bVar3) {
          pFVar6 = ByteCodeGenerator::TopFuncInfo(byteCodeGenerator);
          pSVar2 = this->parentScopeInfo;
          if (((ulong)pSVar2 & 0x200000000) == 0) {
            if (((ulong)pSVar2 & 0x400000000) == 0) {
              if (((ulong)pSVar2 & 0x2000000000) == 0) {
                if (((ulong)pSVar2 & 0x800000000) == 0) {
                  if (((ulong)pSVar2 & 0x1000000000) != 0) {
                    FuncInfo::SetSuperConstructorSymbol(pFVar6,(Symbol *)this);
                    key = this;
                  }
                }
                else {
                  FuncInfo::SetSuperSymbol(pFVar6,(Symbol *)this);
                  key = this;
                }
              }
              else {
                FuncInfo::SetImportMetaSymbol(pFVar6,(Symbol *)this);
                key = this;
              }
            }
            else {
              FuncInfo::SetNewTargetSymbol(pFVar6,(Symbol *)this);
              key = this;
            }
          }
          else {
            FuncInfo::SetThisSymbol(pFVar6,(Symbol *)this);
            pFVar7 = FuncInfo::GetParsedFunctionBody(pFVar6);
            pTVar1 = &(pFVar7->super_ParseableFunctionInfo).flags;
            *pTVar1 = *pTVar1 | Flags_HasThis;
            key = this;
          }
        }
      }
    }
    else {
      bVar3 = Symbol::IsSpecialSymbol((Symbol *)this);
      if (bVar3) goto LAB_0077f2ee;
      pPVar4 = ParseNode::AsParseNodeVar(vars);
      if (pPVar4->pnodeInit == (ParseNodePtr)0x0) goto LAB_0077f2ee;
      pPVar4 = ParseNode::AsParseNodeVar(vars);
      pPVar4->sym = (Symbol *)0x0;
    }
    pPVar4 = ParseNode::AsParseNodeVar(vars);
    vars = pPVar4->pnodeNext;
  } while( true );
}

Assistant:

void AddVarsToScope(ParseNode *vars, ByteCodeGenerator *byteCodeGenerator)
{
    while (vars != nullptr)
    {
        Symbol *sym = byteCodeGenerator->AddSymbolToFunctionScope(reinterpret_cast<const char16*>(vars->AsParseNodeVar()->pid->Psz()), vars->AsParseNodeVar()->pid->Cch(), vars, STVariable);

#if DBG_DUMP
        if (sym->GetSymbolType() == STVariable && byteCodeGenerator->Trace())
        {
            Output::Print(_u("current context has declared var %s of type %s\n"),
                vars->AsParseNodeVar()->pid->Psz(), sym->GetSymbolTypeName());
        }
#endif

        if (sym->IsArguments() || sym->IsSpecialSymbol() || vars->AsParseNodeVar()->pnodeInit == nullptr)
        {
            // LHS's of var decls are usually bound to symbols later, during the Visit/Bind pass,
            // so that things like catch scopes can be taken into account.
            // The exception is "arguments", which always binds to the local scope.
            // We can also bind to the function scope symbol now if there's no init value
            // to assign.
            vars->AsParseNodeVar()->sym = sym;
            if (sym->IsArguments())
            {
                FuncInfo* funcInfo = byteCodeGenerator->TopFuncInfo();
                funcInfo->SetArgumentsSymbol(sym);
            }
            else if (sym->IsSpecialSymbol())
            {
                FuncInfo* funcInfo = byteCodeGenerator->TopFuncInfo();

                if (sym->IsThis())
                {
                    funcInfo->SetThisSymbol(sym);
                    funcInfo->GetParsedFunctionBody()->SetHasThis(true);
                }
                else if (sym->IsNewTarget())
                {
                    funcInfo->SetNewTargetSymbol(sym);
                }
                else if (sym->IsImportMeta())
                {
                    funcInfo->SetImportMetaSymbol(sym);
                }
                else if (sym->IsSuper())
                {
                    funcInfo->SetSuperSymbol(sym);
                }
                else if (sym->IsSuperConstructor())
                {
                    funcInfo->SetSuperConstructorSymbol(sym);
                }
            }
        }
        else
        {
            vars->AsParseNodeVar()->sym = nullptr;
        }
        vars = vars->AsParseNodeVar()->pnodeNext;
    }
}